

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.h
# Opt level: O3

int __thiscall s_i::peek(s_i *this,size_t n)

{
  int iVar1;
  char *pcVar2;
  char *p;
  char *local_20;
  
  if (this->utf8 == true) {
    pcVar2 = this->i;
    local_20 = pcVar2;
    if (n != 0) {
      do {
        if ((this->s->_M_dataplus)._M_p + this->s->_M_string_length <= this->i) {
          return -1;
        }
        read_UTF8_ch(&local_20);
        n = n - 1;
      } while (n != 0);
      pcVar2 = this->i;
    }
    iVar1 = -1;
    if (pcVar2 < (this->s->_M_dataplus)._M_p + this->s->_M_string_length) {
      iVar1 = read_UTF8_ch((char *)0x108181);
    }
  }
  else {
    iVar1 = -1;
    if (this->i + (n - (long)(this->s->_M_dataplus)._M_p) < (char *)this->s->_M_string_length) {
      iVar1 = (int)this->i[n];
    }
  }
  return iVar1;
}

Assistant:

int peek(size_t n = 0) {
        if (utf8) {
            const char* p = i;
            while (n--) {
                if (atEnd())
                    return -1;
                read_UTF8_ch(&p);
            }
            if (atEnd())
                return -1;
            return read_UTF8_ch(p);
        } else {
            if (n + ind() >= s.size()) return -1;
            return i[n];
        }
    }